

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O1

void __thiscall gulcalc::itemoutputgul(gulcalc *this,gulitemSampleslevel *gg)

{
  OASIS_FLOAT OVar1;
  int iVar2;
  _func_void_void_ptr_int_int *p_Var3;
  uchar *puVar4;
  
  p_Var3 = this->itemWriter_;
  if (this->lossWriter_ != (_func_void_void_ptr_int_int *)0x0 ||
      p_Var3 != (_func_void_void_ptr_int_int *)0x0) {
    if (15999 < this->itembufoffset_) {
      if (p_Var3 != (_func_void_void_ptr_int_int *)0x0) {
        (*p_Var3)(this->ibuf_,1,this->itembufoffset_);
      }
      if (this->lossWriter_ != (_func_void_void_ptr_int_int *)0x0) {
        (*this->lossWriter_)(this->ibuf_,1,this->itembufoffset_);
      }
      this->itembufoffset_ = 0;
    }
    if ((gg->event_id != lastitemheader.event_id) || (gg->item_id != lastitemheader.item_id)) {
      if (this->isFirstItemEvent_ == false) {
        puVar4 = this->ibuf_ + this->itembufoffset_;
        puVar4[0] = '\0';
        puVar4[1] = '\0';
        puVar4[2] = '\0';
        puVar4[3] = '\0';
        puVar4[4] = '\0';
        puVar4[5] = '\0';
        puVar4[6] = '\0';
        puVar4[7] = '\0';
        this->itembufoffset_ = this->itembufoffset_ + 8;
      }
      else {
        this->isFirstItemEvent_ = false;
      }
      lastitemheader.event_id = gg->event_id;
      lastitemheader.item_id = gg->item_id;
      *(undefined8 *)(this->ibuf_ + this->itembufoffset_) = *(undefined8 *)gg;
      this->itembufoffset_ = this->itembufoffset_ + 8;
    }
    OVar1 = gg->loss;
    puVar4 = this->ibuf_;
    iVar2 = this->itembufoffset_;
    *(int *)(puVar4 + iVar2) = gg->sidx;
    *(OASIS_FLOAT *)(puVar4 + (long)iVar2 + 4) = OVar1;
    this->itembufoffset_ = this->itembufoffset_ + 8;
  }
  return;
}

Assistant:

void gulcalc::itemoutputgul(gulitemSampleslevel &gg)
{
	if (itemWriter_ == 0 && lossWriter_ == 0)  return;
	if (itembufoffset_ >= bufsize) {
		if (itemWriter_) itemWriter_(ibuf_, sizeof(unsigned char), itembufoffset_);
		if (lossWriter_) lossWriter_(ibuf_, sizeof(unsigned char), itembufoffset_);
		itembufoffset_ = 0;
	}

	if (gg.event_id != lastitemheader.event_id || gg.item_id != lastitemheader.item_id) {
		if (isFirstItemEvent_ == false){
			gulSampleslevelRec r;
			r.sidx = 0;
			r.loss = 0;
			memcpy(ibuf_ + itembufoffset_, &r, sizeof(gulSampleslevelRec));
			itembufoffset_ += sizeof(gulSampleslevelRec);	// null terminate list
		}
		else {
			isFirstItemEvent_ = false;
		}
		lastitemheader.event_id = gg.event_id;
		lastitemheader.item_id = gg.item_id;
		memcpy(ibuf_ + itembufoffset_, &lastitemheader, sizeof(lastitemheader));
		itembufoffset_ += sizeof(lastitemheader);
	}

	gulSampleslevelRec r;
	r.sidx = gg.sidx;
	r.loss = gg.loss;    
	memcpy(ibuf_ + itembufoffset_, &r, sizeof(gulSampleslevelRec));
	itembufoffset_ += sizeof(gulSampleslevelRec);

}